

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O1

void matras_destroy(matras *m)

{
  matras_id_t *pmVar1;
  matras_id_t mVar2;
  matras_id_t mVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  matras_view *v;
  ulong uVar8;
  ulong uVar9;
  ulong local_38;
  
  v = (m->head).prev_view;
  while (v != (matras_view *)0x0) {
    matras_destroy_read_view(m,v);
    v = (m->head).prev_view;
  }
  if ((m->head).block_count != 0) {
    pvVar5 = (m->head).root;
    if ((m->head).block_count != 0) {
      mVar2 = m->mask1;
      mVar3 = m->mask2;
      uVar4 = m->extent_size;
      local_38 = 0;
      uVar7 = 0;
      do {
        pvVar6 = *(void **)((long)pvVar5 + (ulong)uVar7 * 8);
        if (7 < uVar4) {
          uVar9 = 0;
          uVar8 = local_38;
          do {
            if ((m->head).block_count <= uVar8) break;
            (*m->allocator->free_func)(m->allocator,*(void **)((long)pvVar6 + uVar9 * 8));
            m->extent_count = m->extent_count - 1;
            m->stats->extent_count = m->stats->extent_count - 1;
            uVar9 = uVar9 + 1;
            uVar8 = (ulong)((int)uVar8 + mVar3 + 1);
          } while (uVar4 >> 3 != uVar9);
        }
        (*m->allocator->free_func)(m->allocator,pvVar6);
        m->extent_count = m->extent_count - 1;
        m->stats->extent_count = m->stats->extent_count - 1;
        uVar7 = uVar7 + 1;
        local_38 = (ulong)((int)local_38 + mVar2 + 1);
      } while (local_38 < (m->head).block_count);
    }
    (*m->allocator->free_func)(m->allocator,pvVar5);
    pmVar1 = &m->extent_count;
    *pmVar1 = *pmVar1 - 1;
    mVar2 = *pmVar1;
    m->stats->extent_count = m->stats->extent_count - 1;
    if (mVar2 != 0) {
      __assert_fail("m->extent_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                    ,0xa7,"void matras_destroy(struct matras *)");
    }
  }
  return;
}

Assistant:

void
matras_destroy(struct matras *m)
{
	while (m->head.prev_view)
		matras_destroy_read_view(m, m->head.prev_view);
	if (m->head.block_count == 0)
		return;

	matras_id_t step1 = m->mask1 + 1;
	matras_id_t step2 = m->mask2 + 1;
	matras_id_t i1 = 0, j1 = 0, i2, j2;
	matras_id_t ptrs_in_ext = m->extent_size / (matras_id_t)sizeof(void *);
	struct matras_view *v = &m->head;
	void **extent1 = (void **)v->root;
	for (; j1 < v->block_count; i1++, j1 += step1) {
		void **extent2 = (void **)extent1[i1];
		for (i2 = j2 = 0;
		     i2 < ptrs_in_ext && j1 + j2 < v->block_count;
		     i2++, j2 += step2) {
			void **extent3 = (void **)extent2[i2];
			matras_free_extent(m, extent3);
		}
		matras_free_extent(m, extent2);
	}
	matras_free_extent(m, extent1);

	assert(m->extent_count == 0);
}